

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O3

void xemmai::t_code::f_rethrow(void)

{
  wstring_view a_message;
  wstring_view a_message_00;
  undefined8 uVar1;
  long *plVar2;
  t_slot *this;
  char *__s;
  portable *this_00;
  t_object *ptVar3;
  char *in_RCX;
  string_view a_string;
  undefined1 auVar4 [12];
  size_t in_stack_ffffffffffffffb8;
  _Alloc_hider in_stack_ffffffffffffffc0;
  
  std::current_exception();
  auVar4 = std::rethrow_exception(&stack0xffffffffffffffb8);
  if (in_stack_ffffffffffffffb8 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (auVar4._8_4_ == 3) {
    __cxa_begin_catch(auVar4._0_8_);
    uVar1 = __cxa_rethrow();
    __cxa_end_catch();
    _Unwind_Resume(uVar1);
  }
  plVar2 = (long *)__cxa_begin_catch(auVar4._0_8_);
  this = (t_slot *)__cxa_allocate_exception(0x10);
  if (auVar4._8_4_ == 2) {
    __s = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    this_00 = (portable *)strlen(__s);
    a_string._M_str = in_RCX;
    a_string._M_len = (size_t)__s;
    portable::f_convert_abi_cxx11_((wstring *)&stack0xffffffffffffffc0,this_00,a_string);
    a_message._M_str = in_stack_ffffffffffffffc0._M_p;
    a_message._M_len = in_stack_ffffffffffffffb8;
    ptVar3 = t_throwable::f_instantiate(a_message);
    t_slot::t_slot(this,ptVar3);
    __cxa_throw(this,&t_value<xemmai::t_root>::typeinfo,t_root::~t_root);
  }
  a_message_00._M_str = in_stack_ffffffffffffffc0._M_p;
  a_message_00._M_len = in_stack_ffffffffffffffb8;
  ptVar3 = t_throwable::f_instantiate(a_message_00);
  t_slot::t_slot(this,ptVar3);
  __cxa_throw(this,&t_value<xemmai::t_root>::typeinfo,t_root::~t_root);
}

Assistant:

void t_code::f_rethrow()
{
	try {
		std::rethrow_exception(std::current_exception());
	} catch (const t_rvalue&) {
		throw;
	} catch (std::exception& e) {
		throw t_rvalue(t_throwable::f_instantiate(portable::f_convert(e.what())));
	} catch (...) {
		throw t_rvalue(t_throwable::f_instantiate(L"<unknown>."sv));
	}
}